

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O0

void __thiscall soul::Module::Module(Module *this,Program *p,Module *toClone)

{
  Allocator *pAVar1;
  Module *toClone_local;
  Program *p_local;
  Module *this_local;
  
  Program::Program(&this->program,p->pimpl,false);
  std::__cxx11::string::string((string *)&this->shortName,(string *)&toClone->shortName);
  std::__cxx11::string::string((string *)&this->fullName,(string *)&toClone->fullName);
  std::__cxx11::string::string
            ((string *)&this->originalFullName,(string *)&toClone->originalFullName);
  std::
  vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  ::vector(&this->inputs);
  std::
  vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  ::vector(&this->outputs);
  std::
  vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  ::vector(&this->connections);
  std::
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  ::vector(&this->processorInstances);
  Annotation::Annotation(&this->annotation,&toClone->annotation);
  this->sampleRate = 0.0;
  this->latency = 0;
  CodeLocation::CodeLocation(&this->location);
  this->moduleUseTestFlag = false;
  pAVar1 = Program::getAllocator(p);
  this->allocator = pAVar1;
  Functions::Functions(&this->functions,this);
  StateVariables::StateVariables(&this->stateVariables);
  Structs::Structs(&this->structs);
  this->moduleID = 0;
  this->moduleType = toClone->moduleType;
  return;
}

Assistant:

Module::Module (Program& p, const Module& toClone)
   : program (*p.pimpl, false),
     shortName (toClone.shortName),
     fullName (toClone.fullName),
     originalFullName (toClone.originalFullName),
     annotation (toClone.annotation),
     allocator (p.getAllocator()),
     functions (*this),
     moduleType (toClone.moduleType)
{
}